

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O0

void Saig_ManSimulateFrames(Saig_SimObj_t *pAig,int nFrames,int nPref)

{
  uint uVar1;
  int iVar2;
  int local_24;
  Saig_SimObj_t *pSStack_20;
  int f;
  Saig_SimObj_t *pEntry;
  int nPref_local;
  int nFrames_local;
  Saig_SimObj_t *pAig_local;
  
  local_24 = 0;
  do {
    pSStack_20 = pAig;
    if (nFrames <= local_24) {
      return;
    }
    for (; (*(uint *)&pSStack_20->field_0x8 & 0xff) != 7; pSStack_20 = pSStack_20 + 1) {
      if ((*(uint *)&pSStack_20->field_0x8 & 0xff) == 5) {
        Saig_ManSimulateNode(pAig,pSStack_20);
      }
      else if ((*(uint *)&pSStack_20->field_0x8 & 0xff) == 3) {
        Saig_ManSimulateOneInput(pAig,pSStack_20);
      }
      else if ((*(uint *)&pSStack_20->field_0x8 & 0xff) == 2) {
        if (pSStack_20->iFan0 == 0) {
          uVar1 = Aig_ManRandom(0);
          pSStack_20->pData[0] = uVar1;
        }
        else if (0 < local_24) {
          Saig_ManSimulateOneInput(pAig,pSStack_20);
        }
      }
      else if ((*(uint *)&pSStack_20->field_0x8 & 0xff) == 1) {
        pSStack_20->pData[0] = 0xffffffff;
      }
      else if ((*(uint *)&pSStack_20->field_0x8 & 0xff) != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSwitch.c"
                      ,0xc2,"void Saig_ManSimulateFrames(Saig_SimObj_t *, int, int)");
      }
      if (nPref <= local_24) {
        iVar2 = Aig_WordCountOnes(pSStack_20->pData[0]);
        *(uint *)&pSStack_20->field_0x8 =
             *(uint *)&pSStack_20->field_0x8 & 0xff |
             ((*(uint *)&pSStack_20->field_0x8 >> 8) + iVar2) * 0x100;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Saig_ManSimulateFrames( Saig_SimObj_t * pAig, int nFrames, int nPref )
{
    Saig_SimObj_t * pEntry;
    int f;
    for ( f = 0; f < nFrames; f++ )
    {
        for ( pEntry = pAig; pEntry->Type != AIG_OBJ_VOID; pEntry++ )
        {
            if ( pEntry->Type == AIG_OBJ_AND )
                Saig_ManSimulateNode( pAig, pEntry );
            else if ( pEntry->Type == AIG_OBJ_CO )
                Saig_ManSimulateOneInput( pAig, pEntry );
            else if ( pEntry->Type == AIG_OBJ_CI )
            {
                if ( pEntry->iFan0 == 0 ) // true PI
                    pEntry->pData[0] = Aig_ManRandom( 0 );
                else if ( f > 0 ) // register output
                    Saig_ManSimulateOneInput( pAig, pEntry );
            }
            else if ( pEntry->Type == AIG_OBJ_CONST1 )
                pEntry->pData[0] = ~0;
            else if ( pEntry->Type != AIG_OBJ_NONE )
                assert( 0 );
            if ( f >= nPref )
                pEntry->Number += Aig_WordCountOnes( pEntry->pData[0] );
        }
    }
}